

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  size_type sVar1;
  reference ppvVar2;
  reference ppbVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  reference this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_800;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_790;
  allocator<char> local_771;
  string local_770;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  local_750;
  allocator<char> local_731;
  string local_730;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  local_710;
  allocator<char> local_6f1;
  string local_6f0;
  undefined1 local_6d0 [8];
  Table tb;
  int local_688;
  allocator<char> local_681;
  int i;
  allocator<char> local_659;
  string local_658;
  undefined1 local_638 [8];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
  r;
  string local_618;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5f5;
  undefined1 local_5f4;
  allocator<char> local_5f3;
  allocator<char> local_5f2;
  allocator<char> local_5f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  string local_5c8 [32];
  string local_5a8 [32];
  iterator local_588;
  size_type local_580;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_578;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_55d;
  undefined1 local_55c;
  allocator<char> local_55b;
  allocator<char> local_55a;
  allocator<char> local_559;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  string local_530 [32];
  string local_510 [32];
  iterator local_4f0;
  size_type local_4e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c5;
  undefined1 local_4c4;
  allocator<char> local_4c3;
  allocator<char> local_4c2;
  allocator<char> local_4c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  string local_498 [32];
  string local_478 [32];
  iterator local_458;
  size_type local_450;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_42d;
  undefined1 local_42c;
  allocator<char> local_42b;
  allocator<char> local_42a;
  allocator<char> local_429;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  string local_400 [32];
  string local_3e0 [32];
  iterator local_3c0;
  size_type local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  undefined1 local_398 [8];
  Table hp;
  string local_360;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_340;
  undefined1 local_33f;
  allocator<char> local_33e;
  allocator<char> local_33d;
  allocator<char> local_33c;
  allocator<char> local_33b;
  allocator<char> local_33a;
  allocator<char> local_339;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  iterator local_270;
  size_type local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  undefined1 local_247;
  allocator<char> local_246;
  allocator<char> local_245;
  allocator<char> local_244;
  allocator<char> local_243;
  allocator<char> local_242;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  iterator local_178;
  size_type local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_14b;
  undefined1 local_14a;
  allocator<char> local_149;
  allocator<char> local_148;
  allocator<char> local_147;
  allocator<char> local_146;
  allocator<char> local_145 [20];
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  iterator local_68;
  size_type local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  undefined1 local_40 [8];
  Table tab;
  
  tab.Data.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_14a = 1;
  local_130 = &local_128;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"Name",&local_131);
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"Gender",local_145);
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"Age",&local_146);
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"DOB",&local_147);
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"Height",&local_148);
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"Weight",&local_149);
  local_14a = 0;
  local_68 = &local_128;
  local_60 = 6;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_14b);
  __l_05._M_len = local_60;
  __l_05._M_array = local_68;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_58,__l_05,&local_14b);
  Table::Table((Table *)local_40,&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_14b);
  local_800 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68;
  do {
    local_800 = local_800 + -1;
    std::__cxx11::string::~string((string *)local_800);
  } while (local_800 != &local_128);
  std::allocator<char>::~allocator(&local_149);
  std::allocator<char>::~allocator(&local_148);
  std::allocator<char>::~allocator(&local_147);
  std::allocator<char>::~allocator(&local_146);
  std::allocator<char>::~allocator(local_145);
  std::allocator<char>::~allocator(&local_131);
  local_247 = 1;
  local_240 = &local_238;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"Funanya Radomir",&local_241);
  local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_218,"Female",&local_242);
  local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f8,"3",&local_243);
  local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"6/1/2015",&local_244);
  local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"3 ft 1 in",&local_245);
  local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_198,"29.5 lbs",&local_246);
  local_247 = 0;
  local_178 = &local_238;
  local_170 = 6;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_248);
  __l_04._M_len = local_170;
  __l_04._M_array = local_178;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_168,__l_04,&local_248);
  Table::Insert((Table *)local_40,&local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_248);
  local_880 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178;
  do {
    local_880 = local_880 + -1;
    std::__cxx11::string::~string((string *)local_880);
  } while (local_880 != &local_238);
  std::allocator<char>::~allocator(&local_246);
  std::allocator<char>::~allocator(&local_245);
  std::allocator<char>::~allocator(&local_244);
  std::allocator<char>::~allocator(&local_243);
  std::allocator<char>::~allocator(&local_242);
  std::allocator<char>::~allocator(&local_241);
  local_33f = 1;
  local_338 = &local_330;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"Reanna Shekhar",&local_339);
  local_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_310,"Female",&local_33a);
  local_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f0,"15",&local_33b);
  local_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"10/31/2003",&local_33c);
  local_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"5 ft 6 in",&local_33d);
  local_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_290,"130 lbs",&local_33e);
  local_33f = 0;
  local_270 = &local_330;
  local_268 = 6;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_340);
  __l_03._M_len = local_268;
  __l_03._M_array = local_270;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_260,__l_03,&local_340);
  Table::Insert((Table *)local_40,&local_260);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_260);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_340);
  local_900 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_270;
  do {
    local_900 = local_900 + -1;
    std::__cxx11::string::~string((string *)local_900);
  } while (local_900 != &local_330);
  std::allocator<char>::~allocator(&local_33e);
  std::allocator<char>::~allocator(&local_33d);
  std::allocator<char>::~allocator(&local_33c);
  std::allocator<char>::~allocator(&local_33b);
  std::allocator<char>::~allocator(&local_33a);
  std::allocator<char>::~allocator(&local_339);
  Table::Print((Table *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"Patients.csv",
             (allocator<char> *)
             ((long)&hp.Data.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Table::Save((Table *)local_40,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&hp.Data.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_42c = 1;
  local_428 = &local_420;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"Name",&local_429);
  local_428 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_400;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_400,"Stock",&local_42a);
  local_428 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"RequiresID",&local_42b);
  local_42c = 0;
  local_3c0 = &local_420;
  local_3b8 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_42d);
  __l_02._M_len = local_3b8;
  __l_02._M_array = local_3c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3b0,__l_02,&local_42d);
  Table::Table((Table *)local_398,&local_3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3b0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_42d);
  local_958 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c0;
  do {
    local_958 = local_958 + -1;
    std::__cxx11::string::~string((string *)local_958);
  } while (local_958 != &local_420);
  std::allocator<char>::~allocator(&local_42b);
  std::allocator<char>::~allocator(&local_42a);
  std::allocator<char>::~allocator(&local_429);
  local_4c4 = 1;
  local_4c0 = &local_4b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"Ibuprofin",&local_4c1);
  local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_498,"423,243",&local_4c2);
  local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_478,"False",&local_4c3);
  local_4c4 = 0;
  local_458 = &local_4b8;
  local_450 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_4c5);
  __l_01._M_len = local_450;
  __l_01._M_array = local_458;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_448,__l_01,&local_4c5);
  Table::Insert((Table *)local_398,&local_448);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_448);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_4c5);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_458;
  do {
    local_9a8 = local_9a8 + -1;
    std::__cxx11::string::~string((string *)local_9a8);
  } while (local_9a8 != &local_4b8);
  std::allocator<char>::~allocator(&local_4c3);
  std::allocator<char>::~allocator(&local_4c2);
  std::allocator<char>::~allocator(&local_4c1);
  local_55c = 1;
  local_558 = &local_550;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"Psuedophedrine",&local_559);
  local_558 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_530,"345,223",&local_55a);
  local_558 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_510;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_510,"True",&local_55b);
  local_55c = 0;
  local_4f0 = &local_550;
  local_4e8 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_55d);
  __l_00._M_len = local_4e8;
  __l_00._M_array = local_4f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_4e0,__l_00,&local_55d);
  Table::Insert((Table *)local_398,&local_4e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4e0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_55d);
  local_9f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4f0;
  do {
    local_9f8 = local_9f8 + -1;
    std::__cxx11::string::~string((string *)local_9f8);
  } while (local_9f8 != &local_550);
  std::allocator<char>::~allocator(&local_55b);
  std::allocator<char>::~allocator(&local_55a);
  std::allocator<char>::~allocator(&local_559);
  local_5f4 = 1;
  local_5f0 = &local_5e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e8,"Tylenol",&local_5f1);
  local_5f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5c8,"452,334",&local_5f2);
  local_5f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5a8,"False",&local_5f3);
  local_5f4 = 0;
  local_588 = &local_5e8;
  local_580 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_5f5);
  __l._M_len = local_580;
  __l._M_array = local_588;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_578,__l,&local_5f5);
  Table::Insert((Table *)local_398,&local_578);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_578);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_5f5);
  local_a48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_588;
  do {
    local_a48 = local_a48 + -1;
    std::__cxx11::string::~string((string *)local_a48);
  } while (local_a48 != &local_5e8);
  std::allocator<char>::~allocator(&local_5f3);
  std::allocator<char>::~allocator(&local_5f2);
  std::allocator<char>::~allocator(&local_5f1);
  Table::Print((Table *)local_398);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,"Medications.csv",
             (allocator<char> *)
             ((long)&r.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Table::Save((Table *)local_398,&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&r.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"RequiresID",&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"True",&local_681);
  Table::GetRowsWithValue
            ((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
              *)local_638,(Table *)local_398,&local_658,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator(&local_681);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  local_688 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
            ::size((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
                    *)local_638);
    if (sVar1 <= (ulong)(long)local_688) break;
    ppvVar2 = std::
              vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
              ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
                            *)local_638,(long)local_688);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&tb.Data.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppvVar2);
    PrintVector<std::__cxx11::string>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&tb.Data.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&tb.Data.
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_688 = local_688 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f0,"Patients.csv",&local_6f1)
  ;
  Table::Load((Table *)local_6d0,&local_6f0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::allocator<char>::~allocator(&local_6f1);
  Table::Print((Table *)local_6d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"Name",&local_731);
  Table::GetColumn(&local_710,(Table *)local_6d0,&local_730);
  ppbVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
            ::at(&local_710,1);
  std::__cxx11::string::operator=((string *)*ppbVar3,"REDACTED");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::~vector(&local_710);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator(&local_731);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"Name",&local_771);
  Table::GetColumn(&local_750,(Table *)local_6d0,&local_770);
  PrintVector<std::__cxx11::string>(&local_750);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::~vector(&local_750);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator(&local_771);
  pvVar4 = Table::GetRow_abi_cxx11_((Table *)local_6d0,0);
  this = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::at(pvVar4,0);
  std::__cxx11::string::operator=((string *)this,"REDACTED");
  pvVar4 = Table::GetRow_abi_cxx11_((Table *)local_6d0,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_790,pvVar4);
  PrintVector<std::__cxx11::string>(&local_790);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_790);
  Table::~Table((Table *)local_6d0);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
             *)local_638);
  Table::~Table((Table *)local_398);
  Table::~Table((Table *)local_40);
  return tab.Data.
         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
	Table tab({"Name", "Gender", "Age", "DOB", "Height", "Weight"});
	tab.Insert({"Funanya Radomir", "Female", "3", "6/1/2015", "3 ft 1 in", "29.5 lbs"});
	tab.Insert({"Reanna Shekhar", "Female", "15", "10/31/2003", "5 ft 6 in", "130 lbs"});
	tab.Print();
	tab.Save("Patients.csv");

	Table hp({"Name", "Stock", "RequiresID"});
	hp.Insert({"Ibuprofin", "423,243", "False"});
	hp.Insert({"Psuedophedrine", "345,223", "True"});
	hp.Insert({"Tylenol", "452,334", "False"});
	hp.Print();
	hp.Save("Medications.csv");

	std::vector< std::vector < std::string >* > r = hp.GetRowsWithValue("RequiresID", "True");
	for (int i = 0; i < r.size(); i++){
		PrintVector(*r[i]);
		std::cout << std::endl;
	}

	Table tb = Table::Load("Patients.csv");
	tb.Print();
	*tb.GetColumn("Name").at(1) = "REDACTED";
	PrintVector<std::string>(tb.GetColumn("Name"));
	tb.GetRow(0)->at(0) = "REDACTED"; // sets the first value in the first row
	PrintVector(*tb.GetRow(0));
}